

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBufferPool.cpp
# Opt level: O2

void __thiscall
VulkanUtilities::VulkanCommandBufferPool::RecycleCommandBuffer
          (VulkanCommandBufferPool *this,VkCommandBuffer *CmdBuffer)

{
  std::mutex::lock(&this->m_Mutex);
  std::deque<VkCommandBuffer_T*,std::allocator<VkCommandBuffer_T*>>::
  emplace_back<VkCommandBuffer_T*&>
            ((deque<VkCommandBuffer_T*,std::allocator<VkCommandBuffer_T*>> *)&this->m_CmdBuffers,
             CmdBuffer);
  *CmdBuffer = (VkCommandBuffer)0x0;
  LOCK();
  (this->m_BuffCounter).super___atomic_base<int>._M_i =
       (this->m_BuffCounter).super___atomic_base<int>._M_i + -1;
  UNLOCK();
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  return;
}

Assistant:

void VulkanCommandBufferPool::RecycleCommandBuffer(VkCommandBuffer&& CmdBuffer)
{
    std::lock_guard<std::mutex> Lock{m_Mutex};
    m_CmdBuffers.emplace_back(CmdBuffer);
    CmdBuffer = VK_NULL_HANDLE;
#ifdef DILIGENT_DEVELOPMENT
    --m_BuffCounter;
#endif
}